

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

Solution * __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::getSolution(Solution *__return_storage_ptr__,
             PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
             *this)

{
  PartitionGraph *graph;
  ProblemGraph *pPVar1;
  pointer pEVar2;
  double dVar3;
  long lVar4;
  size_t edgeId;
  size_type __n;
  bool bVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  BranchingOptimizer branchingOptimizer;
  
  graph = &this->partitionGraph_;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (&branchingOptimizer,graph);
  dVar3 = branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                    (&branchingOptimizer);
  this->branchingObjective_ = dVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
             &branchingOptimizer.solution_);
  for (edgeId = 0;
      local_88._M_impl.super__Vector_impl_data._M_start + edgeId !=
      local_88._M_impl.super__Vector_impl_data._M_finish; edgeId = edgeId + 1) {
    PartitionGraph::updateBranchingLabel
              (graph,edgeId,local_88._M_impl.super__Vector_impl_data._M_start[edgeId] != '\0');
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::~HungarianBranching
            (&branchingOptimizer);
  pPVar1 = ((this->super_HeuristicBase).data_)->problemGraph;
  __n = (long)(pPVar1->graph_).edges_.
              super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pPVar1->graph_).edges_.
              super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&__return_storage_ptr__->edge_labels,__n);
  lVar4 = 8;
  while (bVar5 = __n != 0, __n = __n - 1, bVar5) {
    pEVar2 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).edges_.
             super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = PartitionGraph::areConnected
                      (graph,*(size_t *)((long)pEVar2->vertexIndices_ + lVar4 + -8),
                       *(size_t *)((long)pEVar2->vertexIndices_ + lVar4));
    branchingOptimizer.super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.
    _vptr_BranchingOptimizer._0_4_ = (uint)!bVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (&__return_storage_ptr__->edge_labels,(int *)&branchingOptimizer);
    lVar4 = lVar4 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Solution
PartitionOptimizerBase<BROPT>::getSolution()
{
    {
        // for the last time, optimize the branching to get
        // a final edge labelling.
        auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
        branchingObjective_ = branchingOptimizer.optimize();

        size_t branchingEdgeId = 0;
        for (auto&& branchingEdgeLabel : branchingOptimizer.getSolution()) {
            partitionGraph_.updateBranchingLabel(branchingEdgeId++,
                                                 branchingEdgeLabel);
        }
    }

    // construct edge labels.
    const auto numberOfEdges = this->data_.problemGraph.graph().numberOfEdges();
    Solution solution;
    solution.edge_labels.reserve(numberOfEdges);

    for (size_t edge = 0; edge < numberOfEdges; ++edge) {
        const auto v0 = this->data_.problemGraph.graph().vertexOfEdge(edge, 0);
        const auto v1 = this->data_.problemGraph.graph().vertexOfEdge(edge, 1);

        solution.edge_labels.emplace_back(
            partitionGraph_.areConnected(v0, v1) ? 0 : 1);
    }
    return solution;
}